

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O3

Error * ot::commissioner::FileLogger::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::FileLogger> *aFileLogger,string *aFilename,
                  LogLevel aLogLevel)

{
  ErrorCode EVar1;
  FileLogger *__p;
  shared_ptr<ot::commissioner::FileLogger> logger;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __p = (FileLogger *)operator_new(0x40);
  (__p->super_Logger)._vptr_Logger = (_func_int **)&PTR__FileLogger_002b13a8;
  (__p->mLogMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->mLogMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->mLogMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->mLogMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (__p->mLogMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::FileLogger*>
            (&local_60,__p);
  Init((Error *)local_58,__p,aFilename,aLogLevel);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    (aFileLogger->super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(aFileLogger->
                super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&local_60);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Error FileLogger::Create(std::shared_ptr<FileLogger> &aFileLogger, const std::string &aFilename, LogLevel aLogLevel)
{
    Error error;
    auto  logger = std::shared_ptr<FileLogger>(new FileLogger);

    SuccessOrExit(error = logger->Init(aFilename, aLogLevel));
    aFileLogger = logger;

exit:
    return error;
}